

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

QSslCipher __thiscall
QTlsBackend::createCiphersuite
          (QTlsBackend *this,QString *suiteName,SslProtocol protocol,QString *protocolString)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  int *piVar3;
  long *plVar4;
  QDebug this_00;
  char cVar5;
  long lVar6;
  long lVar7;
  QLoggingCategory *pQVar8;
  undefined8 uVar9;
  char *pcVar10;
  qsizetype qVar11;
  undefined8 *puVar12;
  QString *this_01;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QByteArrayView QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  char *local_78;
  QDebug local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)this);
  if ((suiteName->d).size == 0) goto LAB_001d444d;
  puVar1 = *(undefined1 **)this;
  *puVar1 = 0;
  QString::operator=((QString *)(puVar1 + 8),(QString *)suiteName);
  lVar7 = *(long *)this;
  *(SslProtocol *)(lVar7 + 0x90) = protocol;
  QString::operator=((QString *)(lVar7 + 0x78),(QString *)protocolString);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  uVar9 = *(undefined8 *)(*(long *)this + 0x10);
  uVar2 = *(undefined8 *)(*(long *)this + 0x18);
  local_90 = (undefined4)uVar2;
  uStack_8c = (undefined4)((ulong)uVar2 >> 0x20);
  uStack_88 = (undefined4)uVar9;
  uStack_84 = (undefined4)((ulong)uVar9 >> 0x20);
  QStringView::split(&local_68,&local_90,0x2d,0,1);
  if ((undefined1 *)0x1 < local_58) {
    if (((ulong)local_58 & 0x7fffffffffffffe) == 2) {
      this_01 = (QString *)(*(long *)this + 0x28);
      pcVar10 = "RSA";
      qVar11 = 3;
LAB_001d4316:
      QVar27.m_data = pcVar10;
      QVar27.m_size = qVar11;
      QString::operator=(this_01,QVar27);
    }
    else {
      plVar4 = (long *)CONCAT44(uStack_5c,uStack_60);
      lVar7 = *plVar4;
      switch(lVar7) {
      case 2:
        QVar13.m_data = "DH";
        QVar13.m_size = 2;
        QVar33.m_data = (storage_type_conflict *)plVar4[1];
        QVar33.m_size = lVar7;
        cVar5 = QtPrivate::equalStrings(QVar13,QVar33);
        if (cVar5 != '\0') goto LAB_001d42a2;
        if (lVar7 == 5) goto switchD_001d424f_caseD_5;
        if (lVar7 == 4) goto switchD_001d424f_caseD_4;
        if (lVar7 == 3) goto switchD_001d424f_caseD_3;
        break;
      case 3:
switchD_001d424f_caseD_3:
        QVar14.m_data = "DHE";
        QVar14.m_size = 3;
        QVar34.m_data = (storage_type_conflict *)plVar4[1];
        QVar34.m_size = lVar7;
        cVar5 = QtPrivate::equalStrings(QVar14,QVar34);
        if (cVar5 != '\0') {
LAB_001d42a2:
          this_01 = (QString *)(*(long *)this + 0x28);
          pcVar10 = "DH";
          qVar11 = 2;
          goto LAB_001d4316;
        }
        if (lVar7 == 5) goto switchD_001d424f_caseD_5;
        if (lVar7 == 4) goto switchD_001d424f_caseD_4;
        break;
      case 4:
switchD_001d424f_caseD_4:
        QVar15.m_data = "ECDH";
        QVar15.m_size = 4;
        QVar35.m_data = (storage_type_conflict *)plVar4[1];
        QVar35.m_size = lVar7;
        cVar5 = QtPrivate::equalStrings(QVar15,QVar35);
        if (cVar5 != '\0') goto LAB_001d4303;
        if (lVar7 == 5) goto switchD_001d424f_caseD_5;
        break;
      case 5:
switchD_001d424f_caseD_5:
        QVar16.m_data = "ECDHE";
        QVar16.m_size = 5;
        QVar36.m_data = (storage_type_conflict *)plVar4[1];
        QVar36.m_size = lVar7;
        cVar5 = QtPrivate::equalStrings(QVar16,QVar36);
        if (cVar5 != '\0') {
LAB_001d4303:
          this_01 = (QString *)(*(long *)this + 0x28);
          pcVar10 = "ECDH";
          qVar11 = 4;
          goto LAB_001d4316;
        }
      }
      pQVar8 = QtPrivateLogging::lcSsl();
      if (((pQVar8->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        createCiphersuite();
      }
    }
    lVar7 = *(long *)this;
    if (((ulong)local_58 & 0x7fffffffffffffe) == 2) {
LAB_001d433c:
      pcVar10 = "RSA";
      qVar11 = 3;
LAB_001d4388:
      QVar28.m_data = pcVar10;
      QVar28.m_size = qVar11;
      QString::operator=((QString *)(lVar7 + 0x40),QVar28);
    }
    else {
      QVar17.m_size = lVar7 + 8;
      QVar17.m_data = (char *)0x7;
      lVar6 = QString::indexOf(QVar17,0x268ced,CaseInsensitive);
      lVar7 = *(long *)this;
      if (lVar6 != -1) {
        pcVar10 = "ECDSA";
        qVar11 = 5;
        goto LAB_001d4388;
      }
      QVar20.m_size = lVar7 + 8;
      QVar20.m_data = (char *)0x5;
      lVar7 = QString::indexOf(QVar20,0x268cfb,CaseInsensitive);
      if (lVar7 != -1) {
        lVar7 = *(long *)this;
        goto LAB_001d433c;
      }
      pQVar8 = QtPrivateLogging::lcSsl();
      if (((pQVar8->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_78 = pQVar8->name;
        local_90 = 2;
        uStack_8c = 0;
        uStack_88 = 0;
        uStack_84 = 0;
        uStack_80 = 0;
        local_7c = 0;
        QMessageLogger::warning();
        this_00.stream = local_70.stream;
        QVar22.m_data = (storage_type *)0xa;
        QVar22.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar22);
        QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        puVar12 = *(undefined8 **)(*(long *)this + 0x10);
        if (puVar12 == (undefined8 *)0x0) {
          puVar12 = &QString::_empty;
        }
        QDebug::putString((QChar *)&local_70,(ulong)puVar12);
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QDebug::~QDebug(&local_70);
      }
    }
    QVar18.m_size = *(long *)this + 8;
    QVar18.m_data = &DAT_00000004;
    lVar6 = QString::indexOf(QVar18,0x268d0c,CaseInsensitive);
    lVar7 = *(long *)this;
    if (lVar6 == -1) {
      QVar19.m_size = lVar7 + 8;
      QVar19.m_data = (char *)0x9;
      lVar7 = QString::indexOf(QVar19,0x268d1a,CaseInsensitive);
      if (lVar7 == -1) {
        QVar21.m_size = *(long *)this + 8;
        QVar21.m_data = (char *)0x7;
        lVar6 = QString::indexOf(QVar21,0x268d2e,CaseInsensitive);
        lVar7 = *(long *)this;
        if (lVar6 != -1) {
          pcVar10 = "AES(128)";
          goto LAB_001d43c1;
        }
        QVar23.m_size = lVar7 + 8;
        QVar23.m_data = (char *)0xa;
        lVar6 = QString::indexOf(QVar23,0x268d3f,CaseInsensitive);
        lVar7 = *(long *)this;
        if (lVar6 == -1) {
          QVar24.m_size = lVar7 + 8;
          QVar24.m_data = (char *)0x7;
          lVar6 = QString::indexOf(QVar24,0x268d56,CaseInsensitive);
          lVar7 = *(long *)this;
          if (lVar6 == -1) {
            QVar25.m_size = lVar7 + 8;
            QVar25.m_data = (char *)0x9;
            lVar6 = QString::indexOf(QVar25,0x268d67,CaseInsensitive);
            lVar7 = *(long *)this;
            if (lVar6 == -1) {
              QVar26.m_size = lVar7 + 8;
              QVar26.m_data = (char *)0x5;
              lVar7 = QString::indexOf(QVar26,0x268d7a,CaseInsensitive);
              if (lVar7 == -1) {
                pQVar8 = QtPrivateLogging::lcSsl();
                if (((pQVar8->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
                  createCiphersuite();
                }
              }
              else {
                QVar32.m_data = "NULL";
                QVar32.m_size = 4;
                QString::operator=((QString *)(*(long *)this + 0x58),QVar32);
              }
              goto LAB_001d442a;
            }
            pcVar10 = "CHACHA20";
          }
          else {
            pcVar10 = "AES(256)";
          }
          qVar11 = 8;
        }
        else {
          pcVar10 = "AESGCM(256)";
          qVar11 = 0xb;
        }
        QVar31.m_data = pcVar10;
        QVar31.m_size = qVar11;
        QString::operator=((QString *)(lVar7 + 0x58),QVar31);
        lVar7 = *(long *)this;
        uVar9 = 0x10000000100;
      }
      else {
        QVar30.m_data = "3DES(168)";
        QVar30.m_size = 9;
        QString::operator=((QString *)(*(long *)this + 0x58),QVar30);
        lVar7 = *(long *)this;
        uVar9 = 0xa8000000a8;
      }
    }
    else {
      pcVar10 = "RC4(128)";
LAB_001d43c1:
      QVar29.m_data = pcVar10;
      QVar29.m_size = 8;
      QString::operator=((QString *)(lVar7 + 0x58),QVar29);
      lVar7 = *(long *)this;
      uVar9 = 0x8000000080;
    }
    *(undefined8 *)(lVar7 + 0x20) = uVar9;
  }
LAB_001d442a:
  piVar3 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),0x10,0x10);
    }
  }
LAB_001d444d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
         (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)this;
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &suiteName, QSsl::SslProtocol protocol,
                                          const QString &protocolString)
{
    QSslCipher ciph;

    if (!suiteName.size())
        return ciph;

    ciph.d->isNull = false;
    ciph.d->name = suiteName;
    ciph.d->protocol = protocol;
    ciph.d->protocolString = protocolString;

    const auto bits = QStringView{ciph.d->name}.split(u'-');
    if (bits.size() >= 2) {
        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->keyExchangeMethod = "RSA"_L1;
        else if (bits.front() == "DH"_L1 || bits.front() == "DHE"_L1)
            ciph.d->keyExchangeMethod = "DH"_L1;
        else if (bits.front() == "ECDH"_L1 || bits.front() == "ECDHE"_L1)
            ciph.d->keyExchangeMethod = "ECDH"_L1;
        else
            qCWarning(lcSsl) << "Unknown Kx" << ciph.d->name;

        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->authenticationMethod = "RSA"_L1;
        else if (ciph.d->name.contains("-ECDSA-"_L1))
            ciph.d->authenticationMethod = "ECDSA"_L1;
        else if (ciph.d->name.contains("-RSA-"_L1))
            ciph.d->authenticationMethod = "RSA"_L1;
        else
            qCWarning(lcSsl) << "Unknown Au" << ciph.d->name;

        if (ciph.d->name.contains("RC4-"_L1)) {
            ciph.d->encryptionMethod = "RC4(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("DES-CBC3-"_L1)) {
            ciph.d->encryptionMethod = "3DES(168)"_L1;
            ciph.d->bits = 168;
            ciph.d->supportedBits = 168;
        } else if (ciph.d->name.contains("AES128-"_L1)) {
            ciph.d->encryptionMethod = "AES(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("AES256-GCM"_L1)) {
            ciph.d->encryptionMethod = "AESGCM(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("AES256-"_L1)) {
            ciph.d->encryptionMethod = "AES(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("CHACHA20-"_L1)) {
            ciph.d->encryptionMethod = "CHACHA20"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("NULL-"_L1)) {
            ciph.d->encryptionMethod = "NULL"_L1;
        } else {
            qCWarning(lcSsl) << "Unknown Enc" << ciph.d->name;
        }
    }
    return ciph;
}